

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mad.cpp
# Opt level: O2

RESULT_TYPE __thiscall
duckdb::MadAccessor<duckdb::date_t,_duckdb::interval_t,_duckdb::timestamp_t>::operator()
          (MadAccessor<duckdb::date_t,_duckdb::interval_t,_duckdb::timestamp_t> *this,
          INPUT_TYPE *input)

{
  int64_t iVar1;
  RESULT_TYPE RVar2;
  timestamp_t dt;
  timestamp_t local_10;
  
  local_10 = Cast::Operation<duckdb::date_t,duckdb::timestamp_t>((date_t)input->days);
  iVar1 = duckdb::timestamp_t::operator-(&local_10,this->median);
  iVar1 = TryAbsOperator::Operation<long,long>(iVar1);
  RVar2 = (RESULT_TYPE)duckdb::Interval::FromMicro(iVar1);
  return RVar2;
}

Assistant:

inline RESULT_TYPE operator()(const INPUT_TYPE &input) const {
		const auto dt = Cast::Operation<date_t, timestamp_t>(input);
		const auto delta = dt - median;
		return Interval::FromMicro(TryAbsOperator::Operation<int64_t, int64_t>(delta));
	}